

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade_group.cpp
# Opt level: O2

void Am_Get_Effects_Buffers
               (Am_Object *screen,unsigned_short buffer,Am_Drawonable **primary,Am_Drawonable **mask
               )

{
  bool bVar1;
  Am_Value *pAVar2;
  long *plVar3;
  Am_Drawonable *pAVar4;
  Am_Wrapper *pAVar5;
  uint uVar6;
  Am_Value_List primary_list;
  Am_Value_List mask_list;
  Am_Value primary_value;
  Am_Value mask_value;
  Am_Style local_40;
  Am_Style local_38;
  
  primary_value.type = 0;
  primary_value.value.wrapper_value = (Am_Wrapper *)0x0;
  mask_value.type = 0;
  mask_value.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(screen,0x7d3,1);
  Am_Value::operator=(&primary_value,pAVar2);
  pAVar2 = Am_Object::Get(screen,0x7d4,1);
  Am_Value::operator=(&mask_value,pAVar2);
  bVar1 = Am_Value_List::Test(&primary_value);
  if (bVar1) {
    Am_Value_List::Am_Value_List(&primary_list,&primary_value);
    Am_Value_List::Am_Value_List(&mask_list,&mask_value);
    Am_Value_List::Start(&primary_list);
    Am_Value_List::Start(&mask_list);
    uVar6 = (uint)buffer;
    while (bVar1 = uVar6 != 0, uVar6 = uVar6 - 1, bVar1) {
      bVar1 = Am_Value_List::Last(&primary_list);
      if (bVar1) break;
      Am_Value_List::Next(&primary_list);
      Am_Value_List::Next(&mask_list);
    }
    bVar1 = Am_Value_List::Last(&primary_list);
    if (bVar1) {
      *primary = (Am_Drawonable *)0x0;
      pAVar4 = (Am_Drawonable *)0x0;
    }
    else {
      pAVar2 = Am_Value_List::Get(&primary_list);
      pAVar4 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(pAVar2);
      *primary = pAVar4;
      pAVar2 = Am_Value_List::Get(&mask_list);
      pAVar4 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(pAVar2);
    }
    *mask = pAVar4;
    Am_Value_List::~Am_Value_List(&mask_list);
    Am_Value_List::~Am_Value_List(&primary_list);
  }
  else if (buffer == 0) {
    pAVar4 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(&primary_value);
    *primary = pAVar4;
    pAVar4 = (Am_Drawonable *)Am_Value::operator_cast_to_void_(&mask_value);
    *mask = pAVar4;
  }
  else {
    *primary = (Am_Drawonable *)0x0;
    *mask = (Am_Drawonable *)0x0;
  }
  if (*primary == (Am_Drawonable *)0x0) {
    pAVar2 = Am_Object::Get(screen,0x7d2,0);
    plVar3 = (long *)Am_Value::operator_cast_to_void_(pAVar2);
    Am_Style::Am_Style(&local_38,&Am_Off_Bits);
    pAVar4 = (Am_Drawonable *)(**(code **)(*plVar3 + 0x10))(plVar3,100,100,&local_38);
    *primary = pAVar4;
    Am_Style::~Am_Style(&local_38);
    Am_Style::Am_Style(&local_40,&Am_Off_Bits);
    pAVar4 = (Am_Drawonable *)(**(code **)(*plVar3 + 0x10))(plVar3,100,100,&local_40);
    *mask = pAVar4;
    Am_Style::~Am_Style(&local_40);
    bVar1 = Am_Value_List::Test(&primary_value);
    uVar6 = (uint)buffer;
    if (bVar1) {
      Am_Value_List::Am_Value_List(&primary_list,&primary_value);
      Am_Value_List::Am_Value_List(&mask_list,&mask_value);
      Am_Value_List::Start(&primary_list);
      Am_Value_List::Start(&mask_list);
      while (bVar1 = uVar6 != 0, uVar6 = uVar6 - 1, bVar1) {
        bVar1 = Am_Value_List::Last(&primary_list);
        if (bVar1) {
          Am_Value_List::Add(&primary_list,(Am_Ptr)0x0,Am_TAIL,true);
          Am_Value_List::Add(&mask_list,(Am_Ptr)0x0,Am_TAIL,true);
        }
        else {
          Am_Value_List::Next(&primary_list);
          Am_Value_List::Next(&mask_list);
        }
      }
      Am_Value_List::Set(&primary_list,*primary,true);
      Am_Value_List::Set(&mask_list,*mask,true);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&primary_list);
      Am_Object::Set(screen,0x7d3,pAVar5,0);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&mask_list);
      Am_Object::Set(screen,0x7d4,pAVar5,0);
    }
    else {
      if (buffer == 0) {
        Am_Object::Set(screen,0x7d3,*primary,0);
        Am_Object::Set(screen,0x7d4,*mask,0);
        goto LAB_001e9f95;
      }
      Am_Value_List::Am_Value_List(&primary_list);
      Am_Value_List::Am_Value_List(&mask_list);
      Am_Value_List::Add(&primary_list,&primary_value,Am_TAIL,true);
      Am_Value_List::Add(&mask_list,&mask_value,Am_TAIL,true);
      while (uVar6 = uVar6 - 1, uVar6 != 0) {
        Am_Value_List::Add(&primary_list,(Am_Ptr)0x0,Am_TAIL,true);
        Am_Value_List::Add(&mask_list,(Am_Ptr)0x0,Am_TAIL,true);
      }
      Am_Value_List::Add(&primary_list,*primary,Am_TAIL,true);
      Am_Value_List::Add(&mask_list,*mask,Am_TAIL,true);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&primary_list);
      Am_Object::Set(screen,0x7d3,pAVar5,0);
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&mask_list);
      Am_Object::Set(screen,0x7d4,pAVar5,0);
    }
    Am_Value_List::~Am_Value_List(&mask_list);
    Am_Value_List::~Am_Value_List(&primary_list);
  }
LAB_001e9f95:
  Am_Value::~Am_Value(&mask_value);
  Am_Value::~Am_Value(&primary_value);
  return;
}

Assistant:

void
Am_Get_Effects_Buffers(Am_Object screen, unsigned short buffer,
                       Am_Drawonable *&primary, Am_Drawonable *&mask)
{
  Am_Value primary_value, mask_value;
  primary_value = screen.Peek(Am_DRAW_BUFFER);
  mask_value = screen.Peek(Am_MASK_BUFFER);
  int i;
  if (Am_Value_List::Test(primary_value)) {
    Am_Value_List primary_list = primary_value;
    Am_Value_List mask_list = mask_value;
    primary_list.Start();
    mask_list.Start();
    for (i = 0; (i < buffer) && !primary_list.Last(); ++i) {
      primary_list.Next();
      mask_list.Next();
    }
    if (primary_list.Last()) {
      primary = nullptr;
      mask = nullptr;
    } else {
      primary = Am_Drawonable::Narrow(primary_list.Get());
      mask = Am_Drawonable::Narrow(mask_list.Get());
    }
  } else if (buffer == 0) {
    primary = Am_Drawonable::Narrow(primary_value);
    mask = Am_Drawonable::Narrow(mask_value);
  } else {
    primary = nullptr;
    mask = nullptr;
  }
  if (!primary) {
    Am_Drawonable *screen_drawonable =
        Am_Drawonable::Narrow(screen.Get(Am_DRAWONABLE));
    primary = screen_drawonable->Create_Offscreen(100, 100, Am_Off_Bits);
    mask = screen_drawonable->Create_Offscreen(100, 100, Am_Off_Bits);
    if (Am_Value_List::Test(primary_value)) {
      Am_Value_List primary_list = primary_value;
      Am_Value_List mask_list = mask_value;
      primary_list.Start();
      mask_list.Start();
      for (i = 0; i < buffer; ++i) {
        if (primary_list.Last()) {
          primary_list.Add((Am_Ptr)nullptr);
          mask_list.Add((Am_Ptr)nullptr);
        } else {
          primary_list.Next();
          mask_list.Next();
        }
      }
      primary_list.Set((Am_Ptr)primary);
      mask_list.Set((Am_Ptr)mask);
      screen.Set(Am_DRAW_BUFFER, primary_list);
      screen.Set(Am_MASK_BUFFER, mask_list);
    } else if (buffer == 0) {
      screen.Set(Am_DRAW_BUFFER, (Am_Ptr)primary);
      screen.Set(Am_MASK_BUFFER, (Am_Ptr)mask);
    } else {
      Am_Value_List primary_list, mask_list;
      primary_list.Add(primary_value);
      mask_list.Add(mask_value);
      for (i = 1; i < buffer; ++i) {
        primary_list.Add((Am_Ptr)nullptr);
        mask_list.Add((Am_Ptr)nullptr);
      }
      primary_list.Add((Am_Ptr)primary);
      mask_list.Add((Am_Ptr)mask);
      screen.Set(Am_DRAW_BUFFER, primary_list);
      screen.Set(Am_MASK_BUFFER, mask_list);
    }
  }
}